

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChTriangleMeshConnected::ArchiveOUT
          (ChTriangleMeshConnected *this,ChArchiveOut *marchive)

{
  ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  ChNameValue<std::vector<int,_std::allocator<int>_>_> local_f0;
  ChNameValue<std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_> local_d8
  ;
  ChNameValue<std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_> local_c0
  ;
  ChNameValue<std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_> local_a8
  ;
  ChNameValue<std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_> local_90
  ;
  ChNameValue<std::vector<chrono::ChColor,_std::allocator<chrono::ChColor>_>_> local_78;
  ChNameValue<std::vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>_>
  local_60;
  ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_48;
  ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_30;
  
  ChArchiveOut::VersionWrite<chrono::geometry::ChTriangleMeshConnected>(marchive);
  ChTriangleMesh::ArchiveOUT(&this->super_ChTriangleMesh,marchive);
  local_30._value = &this->m_vertices;
  local_30._name = "m_vertices";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->m_normals;
  local_48._name = "m_normals";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->m_UV;
  local_60._name = "m_UV";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  local_78._value = &this->m_colors;
  local_78._name = "m_colors";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_78);
  local_90._value = &this->m_face_v_indices;
  local_90._name = "m_face_v_indices";
  local_90._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_90);
  local_a8._value = &this->m_face_n_indices;
  local_a8._name = "m_face_n_indices";
  local_a8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_a8);
  local_c0._value = &this->m_face_uv_indices;
  local_c0._name = "m_face_uv_indices";
  local_c0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_c0);
  local_d8._value = &this->m_face_col_indices;
  local_d8._name = "m_face_col_indices";
  local_d8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_d8);
  local_f0._value = &this->m_face_mat_indices;
  local_f0._name = "m_face_mat_indices";
  local_f0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_f0);
  local_108._value = &this->m_filename;
  local_108._name = "m_filename";
  local_108._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_108);
  return;
}

Assistant:

void ChTriangleMeshConnected::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChTriangleMeshConnected>();
    // serialize parent class
    ChTriangleMesh::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(m_vertices);
    marchive << CHNVP(m_normals);
    marchive << CHNVP(m_UV);
    marchive << CHNVP(m_colors);
    marchive << CHNVP(m_face_v_indices);
    marchive << CHNVP(m_face_n_indices);
    marchive << CHNVP(m_face_uv_indices);
    marchive << CHNVP(m_face_col_indices);
    marchive << CHNVP(m_face_mat_indices);
    marchive << CHNVP(m_filename);
}